

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

Box * __thiscall amrex::BoxArray::operator[](BoxArray *this,MFIter *mfi)

{
  BoxArray *in_RDX;
  char *in_RSI;
  Box *in_RDI;
  
  MFIter::index((MFIter *)in_RDX,in_RSI,(int)in_RDX);
  operator[](in_RDX,(int)((ulong)in_RDI >> 0x20));
  return in_RDI;
}

Assistant:

Box
BoxArray::operator[] (const MFIter& mfi) const noexcept
{
    return (*this)[mfi.index()];
}